

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_>::Data
          (Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_> *this,
          Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_> *other,size_t reserved)

{
  ulong uVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  Node<QStyle::SubControl,_QRect> *pNVar7;
  long lVar8;
  ulong uVar9;
  size_t numBuckets;
  long lVar10;
  long in_FS_OFFSET;
  R RVar11;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  numBuckets = 0x80;
  if (0x40 < reserved) {
    if (reserved >> 0x3e == 0) {
      lVar8 = 0x3f;
      if (reserved != 0) {
        for (; reserved >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar8 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  this->numBuckets = numBuckets;
  RVar11 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar11.spans;
  uVar1 = other->numBuckets;
  lVar8 = 0;
  for (uVar9 = 0; uVar9 != uVar1 >> 7; uVar9 = uVar9 + 1) {
    pSVar2 = other->spans;
    for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 1) {
      uVar6 = (ulong)pSVar2->offsets[lVar10 + lVar8];
      if (uVar6 != 0xff) {
        pEVar3 = pSVar2[uVar9].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = findBucket<QStyle::SubControl>(this,(SubControl *)(pEVar3 + uVar6));
        pNVar7 = Bucket::insert(&local_48);
        uVar4 = *(undefined8 *)pEVar3[uVar6].storage.data;
        uVar5 = *(undefined8 *)(pEVar3[uVar6].storage.data + 8);
        pNVar7->key = (int)uVar4;
        (pNVar7->value).x1 = (Representation)(int)((ulong)uVar4 >> 0x20);
        (pNVar7->value).y1 = (Representation)(int)uVar5;
        (pNVar7->value).x2 = (Representation)(int)((ulong)uVar5 >> 0x20);
        (pNVar7->value).y2.m_i = *(int *)(pEVar3[uVar6].storage.data + 0x10);
      }
    }
    lVar8 = lVar8 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }